

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlBufferWriteQuotedString(xmlBufferPtr buf,xmlChar *string)

{
  xmlBufferAllocationScheme xVar1;
  xmlChar *pxVar2;
  long lVar3;
  
  if ((buf != (xmlBufferPtr)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
    pxVar2 = xmlStrchr(string,'\"');
    if (pxVar2 == (xmlChar *)0x0) {
      if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        return;
      }
      pxVar2 = "\"";
    }
    else {
      pxVar2 = xmlStrchr(string,'\'');
      if (pxVar2 != (xmlChar *)0x0) {
        if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
          xmlBufferAdd(buf,"\"",-1);
        }
        do {
          lVar3 = 0;
          while( true ) {
            if (string[lVar3] == '\0') {
              if (lVar3 != 0) {
                xmlBufferAdd(buf,string,(int)lVar3);
              }
              if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
                return;
              }
              pxVar2 = "\"";
              goto LAB_00187871;
            }
            if (string[lVar3] == '\"') break;
            lVar3 = lVar3 + 1;
          }
          if (lVar3 != 0) {
            xmlBufferAdd(buf,string,(int)lVar3);
          }
          xmlBufferAdd(buf,(xmlChar *)"&quot;",6);
          string = string + lVar3 + 1;
        } while( true );
      }
      if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        return;
      }
      pxVar2 = "\'";
    }
    xmlBufferAdd(buf,pxVar2,-1);
    xVar1 = buf->alloc;
    if (string != (xmlChar *)0x0 && xVar1 != XML_BUFFER_ALLOC_IMMUTABLE) {
      xmlBufferAdd(buf,string,-1);
      xVar1 = buf->alloc;
    }
    if (xVar1 != XML_BUFFER_ALLOC_IMMUTABLE) {
LAB_00187871:
      xmlBufferAdd(buf,pxVar2,-1);
      return;
    }
  }
  return;
}

Assistant:

void
xmlBufferWriteQuotedString(xmlBufferPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if (buf == NULL)
        return;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return;
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
#ifdef DEBUG_BUFFER
	    xmlGenericError(xmlGenericErrorContext,
 "xmlBufferWriteQuotedString: string contains quote and double-quotes !\n");
#endif
	    xmlBufferCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufferAdd(buf, base, cur - base);
                    xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufferAdd(buf, base, cur - base);
	    xmlBufferCCat(buf, "\"");
	}
        else{
	    xmlBufferCCat(buf, "\'");
            xmlBufferCat(buf, string);
	    xmlBufferCCat(buf, "\'");
        }
    } else {
        xmlBufferCCat(buf, "\"");
        xmlBufferCat(buf, string);
        xmlBufferCCat(buf, "\"");
    }
}